

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  ModuleID MVar6;
  int iVar7;
  undefined4 *puVar8;
  undefined8 *aValue;
  ulong uVar9;
  RecyclableObject *this;
  char16 *pcVar10;
  JavascriptString *pJVar11;
  undefined4 extraout_var;
  JavascriptBoolean *pJVar12;
  char16_t *pcVar13;
  OpCode OVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  
  Output::Print(L"    Constant Table:\n    ======== =====\n    ");
  uVar16 = 1;
  uVar4 = FunctionBody::GetCountField(dumpFunction,ConstantCount);
  if (1 < uVar4) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      Output::Print(L" R%d ",uVar16);
      aValue = (undefined8 *)FunctionBody::GetConstantVar(dumpFunction,(RegSlot)uVar16);
      if (aValue != (undefined8 *)0x0) {
        uVar9 = (ulong)aValue & 0xffff000000000000;
        bVar17 = ((ulong)aValue & 0x1ffff00000000) != 0x1000000000000;
        if (bVar17 && uVar9 == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                      ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                      "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar3) goto LAB_007ea664;
          *puVar8 = 0;
        }
        else if (uVar9 != 0x1000000000000) {
          if (aValue == &NullFrameDisplay) {
            OVar14 = LdNullDisplay;
          }
          else {
            if (aValue != &StrictNullFrameDisplay) {
              if (aValue < (undefined8 *)0x4000000000000) goto LAB_007ea206;
              goto switchD_007ea2e2_caseD_4;
            }
            OVar14 = LdStrictNullDisplay;
          }
          pcVar10 = OpCodeUtil::GetOpCodeName(OVar14);
          Output::Print(L"%-10s",pcVar10);
          goto LAB_007ea62e;
        }
        pcVar10 = OpCodeUtil::GetOpCodeName(LdC_A_I4);
        Output::Print(L"%-10s",pcVar10);
        if (bVar17 && uVar9 == 0x1000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
          if (!bVar17) {
LAB_007ea664:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
        Output::Print(L" int:%d ",(ulong)aValue & 0xffffffff);
        goto LAB_007ea62e;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                   ,0x8f,"(varConst != nullptr)","varConst != nullptr");
      if (!bVar17) goto LAB_007ea664;
      *puVar8 = 0;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar8 = 1;
      bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                   ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar17) goto LAB_007ea664;
      *puVar8 = 0;
LAB_007ea206:
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar17) goto LAB_007ea664;
        *puVar8 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar1) && (BVar5 = RecyclableObject::IsExternal(this), BVar5 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                     "GetTypeId aValue has invalid TypeId");
        if (!bVar17) goto LAB_007ea664;
        *puVar8 = 0;
      }
      if (0x20 < (int)TVar1) {
        if (TVar1 == TypeIds_ArrayLastWithES5) {
          Output::Print(L"%-10s",L"LdStringTemplate");
          FunctionProxy::GetScriptContext((FunctionProxy *)dumpFunction);
          pcVar10 = JavascriptLibrary::GetStringTemplateCallsiteObjectKey(aValue);
          Output::Print(L" (\"%s\")",pcVar10);
        }
        else {
          if (TVar1 == TypeIds_GlobalObject) {
            OVar14 = LdRoot;
            goto LAB_007ea5b2;
          }
          if (TVar1 != TypeIds_LastTrueJavascriptObjectType) goto switchD_007ea2e2_caseD_3;
          pcVar10 = OpCodeUtil::GetOpCodeName(LdModuleRoot);
          Output::Print(L"%-10s",pcVar10);
          MVar6 = FunctionBody::GetModuleID(dumpFunction);
          Output::Print(L" int:%d ",(ulong)MVar6);
        }
        goto LAB_007ea62e;
      }
      switch(TVar1) {
      case TypeIds_Undefined:
        pcVar10 = OpCodeUtil::GetOpCodeName(Ld_A);
        Output::Print(L"%-10s",pcVar10);
        pcVar13 = L" (undefined)";
        goto LAB_007ea552;
      case TypeIds_Null:
        pcVar10 = OpCodeUtil::GetOpCodeName(Ld_A);
        Output::Print(L"%-10s",pcVar10);
        pcVar13 = L" (null)";
LAB_007ea552:
        Output::Print(pcVar13);
        break;
      case TypeIds_Boolean:
        pJVar12 = VarTo<Js::JavascriptBoolean>(aValue);
        OVar14 = (ushort)(pJVar12->value == 0) * 2 + LdTrue;
        goto LAB_007ea5b2;
      default:
switchD_007ea2e2_caseD_3:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                     ,0xe9,"((0))","Unexpected object type in DumpConstantTable");
        if (!bVar17) goto LAB_007ea664;
        *puVar8 = 0;
        break;
      case TypeIds_Number:
switchD_007ea2e2_caseD_4:
        pcVar10 = OpCodeUtil::GetOpCodeName(LdC_A_R8);
        Output::Print(L"%-10s",pcVar10);
        if (aValue < (undefined8 *)0x4000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar8 = 1;
          bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                       ,0xd4,"(Is(aValue))",
                                       "Ensure var is actually a \'JavascriptNumber\'");
          if (!bVar17) goto LAB_007ea664;
          *puVar8 = 0;
        }
        Output::Print(L"%G",(ulong)aValue ^ 0xfffc000000000000);
        break;
      case TypeIds_String:
        pcVar10 = OpCodeUtil::GetOpCodeName(LdStr);
        Output::Print(L"%-10s",pcVar10);
        pJVar11 = VarTo<Js::JavascriptString>(aValue);
        iVar7 = (*(pJVar11->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar11);
        bVar17 = VarIs<Js::PropertyString>(aValue);
        pcVar13 = L"";
        if (bVar17) {
          pcVar13 = L" [prop]";
        }
        Output::Print(L" (\"%s\")%s",CONCAT44(extraout_var,iVar7),pcVar13);
        break;
      case TypeIds_BigInt:
        OVar14 = BigIntLiteral;
LAB_007ea5b2:
        pcVar10 = OpCodeUtil::GetOpCodeName(OVar14);
        Output::Print(L"%-10s",pcVar10);
      }
LAB_007ea62e:
      Output::Print(L"\n    ");
      uVar15 = (RegSlot)uVar16 + 1;
      uVar16 = (ulong)uVar15;
    } while (uVar4 != uVar15);
  }
  Output::Print(L"\n");
  return;
}

Assistant:

void ByteCodeDumper::DumpConstantTable(FunctionBody *dumpFunction)
    {
        Output::Print(_u("    Constant Table:\n    ======== =====\n    "));
        uint count = dumpFunction->GetConstantCount();
        for (RegSlot reg = FunctionBody::FirstRegSlot; reg < count; reg++)
        {
            DumpReg(reg);
            Var varConst = dumpFunction->GetConstantVar(reg);
            Assert(varConst != nullptr);
            if (TaggedInt::Is(varConst))
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_I4));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                DumpI4(TaggedInt::ToInt32(varConst));
            }
            else if (varConst == (Js::Var)&Js::NullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (NullDisplay)"));
#endif
            }
            else if (varConst == (Js::Var)&Js::StrictNullFrameDisplay)
            {
#if ENABLE_NATIVE_CODEGEN
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStrictNullDisplay));
#else
                Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                Output::Print(_u(" (StrictNullDisplay)"));
#endif
            }
            else
            {
                switch (JavascriptOperators::GetTypeId(varConst))
                {
                case Js::TypeIds_Undefined:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (undefined)"));
                    break;
                case Js::TypeIds_Null:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
                    Output::Print(_u(" (null)"));
                    break;
                case Js::TypeIds_Boolean:
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(
                        VarTo<JavascriptBoolean>(varConst)->GetValue() ? OpCode::LdTrue : OpCode::LdFalse));
                    break;
                case Js::TypeIds_Number:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdC_A_R8));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u("%G"), JavascriptNumber::GetValue(varConst));
                    break;
                case Js::TypeIds_BigInt:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::BigIntLiteral));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_String:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdStr));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    Output::Print(_u(" (\"%s\")%s"), VarTo<JavascriptString>(varConst)->GetSz(), Js::VarIs<Js::PropertyString>(varConst) ? _u(" [prop]") : _u(""));
                    break;
                case Js::TypeIds_GlobalObject:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    break;
                case Js::TypeIds_ModuleRoot:
#if ENABLE_NATIVE_CODEGEN
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::LdModuleRoot));
#else
                    Output::Print(_u("%-10s"), OpCodeUtil::GetOpCodeName(OpCode::Ld_A));
#endif
                    DumpI4(dumpFunction->GetModuleID());
                    break;
                case Js::TypeIds_ES5Array:
                    // ES5Array objects in the constant table are always string template callsite objects.
                    // If we later put other ES5Array objects in the constant table, we'll need another way
                    // to decide the constant type.
                    Output::Print(_u("%-10s"), _u("LdStringTemplate"));
                    Output::Print(_u(" (\"%s\")"), dumpFunction->GetScriptContext()->GetLibrary()->GetStringTemplateCallsiteObjectKey(varConst));
                    break;
                default:
                    AssertMsg(UNREACHED, "Unexpected object type in DumpConstantTable");
                    break;
                }
            }
            Output::Print(_u("\n    "));
        }
        Output::Print(_u("\n"));
    }